

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.hh
# Opt level: O3

void __thiscall
avro::
NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
::NodeImpl(NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *this,Type type,SingleAttribute<avro::Name> *name,
          MultiAttribute<boost::shared_ptr<avro::Node>_> *leaves,
          MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *leafNames,NoAttribute<int> *size)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_Node).type_ = type;
  (this->super_Node).locked_ = false;
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__NodeImpl_001801c0;
  concepts::SingleAttribute<avro::Name>::SingleAttribute(&this->nameAttribute_,name);
  std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
  vector(&(this->leafAttributes_).attrs_,&leaves->attrs_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(this->leafNameAttributes_).attrs_,&leafNames->attrs_);
  p_Var1 = &(this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->nameIndex_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

NodeImpl(Type type, 
             const NameConcept &name, 
             const LeavesConcept &leaves, 
             const LeafNamesConcept &leafNames,
             const SizeConcept &size) :
        Node(type),
        nameAttribute_(name),
        leafAttributes_(leaves),
        leafNameAttributes_(leafNames),
        sizeAttribute_(size)
    { }